

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

int * Saig_ManBmcMapping(Gia_ManBmc_t *p,Aig_Obj_t *pObj)

{
  Vec_Int_t *p_00;
  int iVar1;
  int *piVar2;
  
  iVar1 = Vec_IntEntry(p->vMapping,pObj->Id);
  if (iVar1 != 0) {
    p_00 = p->vMapping;
    iVar1 = Vec_IntEntry(p_00,pObj->Id);
    piVar2 = Vec_IntEntryP(p_00,iVar1);
    return piVar2;
  }
  return (int *)0x0;
}

Assistant:

static inline int * Saig_ManBmcMapping( Gia_ManBmc_t * p, Aig_Obj_t * pObj )
{
    if ( Vec_IntEntry(p->vMapping, Aig_ObjId(pObj)) == 0 )
        return NULL;
    return Vec_IntEntryP( p->vMapping, Vec_IntEntry(p->vMapping, Aig_ObjId(pObj)) );
}